

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

void __thiscall icu_63::UVector32::setSize(UVector32 *this,int32_t newSize)

{
  UBool UVar1;
  uint in_EAX;
  uint uVar2;
  UErrorCode ec;
  undefined8 uStack_18;
  
  if (-1 < newSize) {
    uVar2 = this->count;
    if ((int)uVar2 < newSize) {
      uStack_18 = (ulong)in_EAX;
      if (this->capacity < newSize) {
        UVar1 = expandCapacity(this,newSize,(UErrorCode *)((long)&uStack_18 + 4));
        if (UVar1 == '\0') {
          return;
        }
        uVar2 = this->count;
      }
      if ((int)uVar2 < newSize) {
        memset(this->elements + (int)uVar2,0,(ulong)(~uVar2 + newSize) * 4 + 4);
      }
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector32::setSize(int32_t newSize) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        UErrorCode ec = U_ZERO_ERROR;
        if (!ensureCapacity(newSize, ec)) {
            return;
        }
        for (i=count; i<newSize; ++i) {
            elements[i] = 0;
        }
    } 
    count = newSize;
}